

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::list<bool,std::allocator<bool>>,void>
               (list<bool,_std::allocator<bool>_> *container,ostream *os)

{
  bool bVar1;
  char8_t *pcVar2;
  long lVar3;
  _List_node_base *p_Var4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  lVar3 = 0;
  p_Var4 = (_List_node_base *)container;
  do {
    p_Var4 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)container) break;
    if (lVar3 == 0) {
LAB_001d4734:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      pcVar2 = "some_false";
      if ((ulong)*(byte *)&p_Var4[1]._M_next != 0) {
        pcVar2 = "some_true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,pcVar2 + 5,(ulong)*(byte *)&p_Var4[1]._M_next ^ 5);
      lVar3 = lVar3 + 1;
      bVar1 = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
      if (lVar3 != 0x20) goto LAB_001d4734;
      std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
      lVar3 = 0x20;
      bVar1 = false;
    }
  } while (bVar1);
  if (lVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }